

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

DVector2 FindRefPoint(line_t *ld,DVector2 *pos)

{
  bool bVar1;
  uint uVar2;
  TVector2<double> *in_RDX;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  TVector2<double> TVar3;
  DVector2 DVar4;
  TVector2<double> local_58;
  double local_48;
  double r;
  DVector2 d;
  DVector2 v1;
  DVector2 *pos_local;
  line_t *ld_local;
  
  bVar1 = secplane_t::isSlope((secplane_t *)((long)pos[7].Y + 0xb0));
  if (((((bVar1) || (bVar1 = secplane_t::isSlope((secplane_t *)((long)pos[8].X + 0xb0)), bVar1)) ||
       (bVar1 = secplane_t::isSlope((secplane_t *)((long)pos[7].Y + 0xd8)), bVar1)) ||
      ((bVar1 = secplane_t::isSlope((secplane_t *)((long)pos[8].X + 0xd8)), bVar1 ||
       (uVar2 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)
                           (*(long *)((long)pos[8].X + 0x210) + 0x70)), uVar2 != 0)))) ||
     ((uVar2 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                         ((TArray<F3DFloor_*,_F3DFloor_*> *)
                          (*(long *)((long)pos[7].Y + 0x210) + 0x70)), uVar2 != 0 ||
      ((bVar1 = sector_t::PortalBlocksMovement((sector_t *)pos[7].Y,1), !bVar1 ||
       (bVar1 = sector_t::PortalBlocksMovement((sector_t *)pos[7].Y,0), !bVar1)))))) {
    vertex_t::fPos((vertex_t *)&d.Y);
    line_t::Delta((line_t *)&r);
    local_48 = clamp<double>(((in_RDX->X - d.Y) * r + (in_RDX->Y - v1.X) * d.X) /
                             (r * r + d.X * d.X),0.0,1.0);
    operator*(&local_58,local_48);
    TVar3 = TVector2<double>::operator+((TVector2<double> *)ld,(TVector2<double> *)&d.Y);
  }
  else {
    TVector2<double>::TVector2((TVector2<double> *)ld,in_RDX);
    TVar3.Y = in_XMM1_Qa;
    TVar3.X = extraout_XMM0_Qa;
  }
  DVar4.X = TVar3.X;
  DVar4.Y = TVar3.Y;
  return DVar4;
}

Assistant:

static DVector2 FindRefPoint(line_t *ld, const DVector2 &pos)
{
	// If there's any chance of slopes getting in the way we need to get a proper refpoint, otherwise we can save the work.
	// Slopes can get in here when:
	// - the actual sector planes are sloped
	// - there's 3D floors in this sector
	// - there's a crossable floor portal (for which the dropoff needs to be calculated within P_LineOpening, and the lower sector can easily have slopes)
	//
	// Todo: check if this bootload of checks even helps or if it adds more than it saves
	//
	if 	(ld->frontsector->floorplane.isSlope() ||
			ld->backsector->floorplane.isSlope() ||
			ld->frontsector->ceilingplane.isSlope() ||
			ld->backsector->ceilingplane. isSlope() ||
			ld->backsector->e->XFloor.ffloors.Size() != 0 ||
			ld->frontsector->e->XFloor.ffloors.Size() != 0 ||
			!ld->frontsector->PortalBlocksMovement(sector_t::ceiling) ||
			!ld->frontsector->PortalBlocksMovement(sector_t::floor))
	{

		DVector2 v1 = ld->v1->fPos();
		DVector2 d = ld->Delta();
		double r = clamp(((pos.X - v1.X) * d.X + (pos.Y - v1.Y) * d.Y) / (d.X*d.X + d.Y*d.Y), 0., 1.);
		return v1 + d*r;
	}
	return pos;
}